

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_half(secp256k1_fe *r)

{
  long in_RDI;
  secp256k1_fe *in_stack_00000030;
  
  secp256k1_fe_verify(r);
  secp256k1_fe_verify_magnitude(r,(int)((ulong)in_RDI >> 0x20));
  secp256k1_fe_impl_half(in_stack_00000030);
  *(int *)(in_RDI + 0x28) = (*(int *)(in_RDI + 0x28) >> 1) + 1;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  secp256k1_fe_verify(r);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_half(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY_MAGNITUDE(r, 31);

    secp256k1_fe_impl_half(r);
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}